

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixError(anon_unknown_1 *this,string *context,int error_number)

{
  Code code;
  long in_FS_OFFSET;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (error_number == 2) {
    local_30.data_ = (context->_M_dataplus)._M_p;
    local_30.size_ = context->_M_string_length;
    local_40.data_ = strerror(2);
    local_40.size_ = strlen(local_40.data_);
    code = kNotFound;
  }
  else {
    local_30.data_ = (context->_M_dataplus)._M_p;
    local_30.size_ = context->_M_string_length;
    local_40.data_ = strerror(error_number);
    local_40.size_ = strlen(local_40.data_);
    code = kIOError;
  }
  Status::Status((Status *)this,code,&local_30,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}